

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O0

void __thiscall
QAbstractItemModelTesterPrivate::rowsAboutToBeInserted
          (QAbstractItemModelTesterPrivate *this,QModelIndex *parent,int start,int end)

{
  bool bVar1;
  undefined4 uVar2;
  int arole;
  QVariant *pQVar3;
  QAbstractItemModel *pQVar4;
  QAbstractItemModel *pQVar5;
  undefined4 in_ECX;
  int in_EDX;
  ChangeInFlight *in_RSI;
  QAbstractItemModelTesterPrivate *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  Changing c;
  undefined4 uVar6;
  int in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  QVariant *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  QModelIndex *in_stack_fffffffffffffd88;
  QDebug *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda8;
  QDebug *in_stack_fffffffffffffdc8;
  char *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  undefined1 local_1c8 [24];
  undefined1 local_1b0 [24];
  undefined1 local_198 [24];
  undefined1 local_180 [32];
  int in_stack_fffffffffffffea0;
  QDebug local_130;
  QDebug local_128;
  QDebug local_120;
  QDebug local_118;
  QDebug local_110;
  QDebug local_108;
  undefined4 local_fc;
  undefined1 *local_f8;
  undefined1 *local_f0;
  QVariant local_e8;
  QVariant local_c8;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_fc = 0;
  uVar6 = 0x330;
  bVar1 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (in_RDI,in_RSI,(ChangeInFlight *)CONCAT44(in_EDX,in_ECX),
                     in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,(char *)in_RDI,
                     in_stack_fffffffffffffea0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    in_RDI->changeInFlight = RowsInserted;
    local_f8 = &DAT_aaaaaaaaaaaaaaaa;
    local_f0 = &DAT_aaaaaaaaaaaaaaaa;
    lcModelTest();
    anon_unknown.dwarf_21e2d9::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffd6c,uVar6));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_f8), bVar1) {
      anon_unknown.dwarf_21e2d9::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x18f4e7);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 (char *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                 (char *)CONCAT44(in_stack_fffffffffffffd6c,uVar6),(char *)0x18f506);
      QMessageLogger::debug();
      QDebug::operator<<(in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffdc8);
      QDebug::operator<<(in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffdc8);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                         in_stack_fffffffffffffd6c);
      QDebug::operator<<(in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffdc8);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                         in_stack_fffffffffffffd6c);
      in_stack_fffffffffffffdc8 =
           QDebug::operator<<(in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffdc8);
      QDebug::QDebug(&local_128,in_stack_fffffffffffffdc8);
      ::operator<<((Stream *)&local_120,(QModelIndex *)&local_128);
      QDebug::operator<<(in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffdc8);
      pQVar5 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x18f621);
      (**(code **)(*(long *)pQVar5 + 0x90))(&local_28,pQVar5,in_RSI,0);
      QVariant::toString();
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         (QString *)in_stack_fffffffffffffd78);
      QDebug::operator<<(in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffdc8);
      pQVar5 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x18f69d);
      uVar2 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,in_RSI);
      pQVar3 = (QVariant *)
               QDebug::operator<<((QDebug *)
                                  CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                                  in_stack_fffffffffffffd6c);
      in_stack_fffffffffffffd98 =
           QDebug::operator<<(in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffdc8);
      QDebug::QDebug(&local_118,in_stack_fffffffffffffd98);
      pQVar5 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x18f709);
      (**(code **)(*(long *)pQVar5 + 0x60))(local_180,pQVar5,in_EDX + -1,0,in_RSI);
      ::operator<<((Stream *)&local_110,(QModelIndex *)&local_118);
      in_stack_fffffffffffffd88 = (QModelIndex *)&in_RDI->model;
      pQVar5 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x18f767);
      pQVar4 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x18f776);
      (**(code **)(*(long *)pQVar4 + 0x60))(local_198,pQVar4,in_EDX + -1,0,in_RSI);
      (**(code **)(*(long *)pQVar5 + 0x90))(&local_48,pQVar5,local_198,0);
      ::operator<<((QDebug *)CONCAT44(uVar2,in_stack_fffffffffffffda8),pQVar3);
      QDebug::~QDebug(&local_108);
      QVariant::~QVariant(&local_48);
      QDebug::~QDebug(&local_110);
      QDebug::~QDebug(&local_118);
      QString::~QString((QString *)0x18f824);
      QVariant::~QVariant(&local_28);
      QDebug::~QDebug(&local_120);
      QDebug::~QDebug(&local_128);
      QDebug::~QDebug(&local_130);
      local_f0 = (undefined1 *)((ulong)local_f0 & 0xffffffffffffff00);
    }
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    Changing::Changing((Changing *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    local_98 = *(undefined1 **)(in_RSI + 4);
    local_a8 = *(undefined1 **)in_RSI;
    puStack_a0 = *(undefined1 **)(in_RSI + 2);
    pQVar5 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x18fa20);
    arole = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,in_RSI);
    puStack_90 = (undefined1 *)CONCAT44(puStack_90._4_4_,arole);
    if (in_EDX + -1 < 0) {
      QVariant::QVariant((QVariant *)0x18fab6);
    }
    else {
      pQVar5 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x18fa65);
      (**(code **)(*(long *)pQVar5 + 0x60))(local_1b0,pQVar5,in_EDX + -1,0,in_RSI);
      QModelIndex::data(in_stack_fffffffffffffd88,arole);
    }
    QVariant::operator=(in_stack_fffffffffffffd78,
                        (QVariant *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    QVariant::~QVariant(&local_c8);
    if (in_EDX < (int)puStack_90) {
      pQVar5 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x18fafd);
      (**(code **)(*(long *)pQVar5 + 0x60))(local_1c8,pQVar5,in_EDX,0,in_RSI);
      QModelIndex::data(in_stack_fffffffffffffd88,arole);
    }
    else {
      QVariant::QVariant((QVariant *)0x18fb4c);
    }
    pQVar3 = &local_e8;
    QVariant::operator=(pQVar3,(QVariant *)
                               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    QVariant::~QVariant(pQVar3);
    QStack<QAbstractItemModelTesterPrivate::Changing>::push
              ((QStack<QAbstractItemModelTesterPrivate::Changing> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (Changing *)CONCAT44(in_stack_fffffffffffffd6c,uVar6));
    Changing::~Changing((Changing *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemModelTesterPrivate::rowsAboutToBeInserted(const QModelIndex &parent, int start, int end)
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::None);
    changeInFlight = ChangeInFlight::RowsInserted;

    qCDebug(lcModelTest) << "rowsAboutToBeInserted"
                         << "start=" << start << "end=" << end << "parent=" << parent
                         << "parent data=" << model->data(parent).toString()
                         << "current count of parent=" << model->rowCount(parent)
                         << "last before insertion=" << model->index(start - 1, 0, parent) << model->data(model->index(start - 1, 0, parent));

    Changing c;
    c.parent = parent;
    c.oldSize = model->rowCount(parent);
    c.last = (start - 1 >= 0) ? model->index(start - 1, 0, parent).data() : QVariant();
    c.next = (start < c.oldSize) ? model->index(start, 0, parent).data() : QVariant();
    insert.push(c);
}